

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__psd_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                     int bpc)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  short sVar23;
  stbi_uc sVar24;
  stbi_uc sVar25;
  byte bVar26;
  char cVar27;
  stbi__uint16 sVar28;
  stbi__uint32 sVar29;
  stbi__uint32 x_00;
  stbi__uint32 sVar30;
  stbi__uint16 *data;
  long lVar31;
  ulong uVar32;
  int iVar33;
  ulong uVar34;
  uint uVar35;
  uint uVar36;
  stbi_uc *psVar37;
  uint uVar38;
  int iVar39;
  stbi__uint16 *psVar40;
  uint uVar41;
  stbi__uint16 *psVar43;
  stbi__uint16 *psVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  int iVar55;
  undefined1 auVar51 [16];
  int iVar56;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  int iVar117;
  float fVar118;
  int iVar126;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  stbi__uint16 *local_80;
  ulong uVar42;
  
  sVar29 = stbi__get32be(s);
  if (sVar29 != 0x38425053) {
    stbi__g_failure_reason = "not PSD";
    return (void *)0x0;
  }
  sVar24 = stbi__get8(s);
  sVar25 = stbi__get8(s);
  if (CONCAT11(sVar24,sVar25) != 1) {
    stbi__g_failure_reason = "wrong version";
    return (void *)0x0;
  }
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
    psVar37 = s->img_buffer;
  }
  else {
    psVar37 = s->img_buffer;
    iVar33 = (int)s->img_buffer_end - (int)psVar37;
    if (iVar33 < 6) {
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,6 - iVar33);
      goto LAB_001095a2;
    }
  }
  s->img_buffer = psVar37 + 6;
LAB_001095a2:
  sVar24 = stbi__get8(s);
  bVar26 = stbi__get8(s);
  uVar35 = (uint)CONCAT11(sVar24,bVar26);
  if (uVar35 < 0x11) {
    sVar29 = stbi__get32be(s);
    x_00 = stbi__get32be(s);
    sVar24 = stbi__get8(s);
    sVar25 = stbi__get8(s);
    sVar23 = CONCAT11(sVar24,sVar25);
    if ((sVar23 == 8) || (sVar23 == 0x10)) {
      sVar24 = stbi__get8(s);
      sVar25 = stbi__get8(s);
      if (CONCAT11(sVar24,sVar25) == 3) {
        sVar30 = stbi__get32be(s);
        stbi__skip(s,sVar30);
        sVar30 = stbi__get32be(s);
        stbi__skip(s,sVar30);
        sVar30 = stbi__get32be(s);
        stbi__skip(s,sVar30);
        sVar24 = stbi__get8(s);
        sVar25 = stbi__get8(s);
        uVar1 = CONCAT11(sVar24,sVar25);
        if (uVar1 < 2) {
          iVar33 = stbi__mad3sizes_valid(4,x_00,sVar29,0);
          if (iVar33 == 0) {
            stbi__g_failure_reason = "too large";
          }
          else {
            if (((bpc == 0x10) && (sVar23 == 0x10)) && (uVar1 == 0)) {
              data = (stbi__uint16 *)stbi__malloc_mad3(8,x_00,sVar29,0);
              ri->bits_per_channel = 0x10;
            }
            else {
              data = (stbi__uint16 *)malloc((long)(int)(sVar29 * x_00 * 4));
            }
            if (data != (stbi__uint16 *)0x0) {
              uVar41 = x_00 * sVar29;
              uVar42 = (ulong)uVar41;
              if (uVar1 == 0) {
                lVar31 = uVar42 - 1;
                auVar51._8_4_ = (int)lVar31;
                auVar51._0_8_ = lVar31;
                auVar51._12_4_ = (int)((ulong)lVar31 >> 0x20);
                psVar43 = data + 0x1e;
                psVar44 = data + 0x1c;
                uVar32 = 0;
                psVar40 = data;
                auVar136 = _DAT_00112a30;
                local_80 = data;
                do {
                  if (uVar32 < uVar35) {
                    if (ri->bits_per_channel == 0x10) {
                      if (0 < (int)uVar41) {
                        lVar31 = 0;
                        do {
                          sVar24 = stbi__get8(s);
                          sVar25 = stbi__get8(s);
                          auVar136 = _DAT_00112a30;
                          local_80[lVar31 * 4] = CONCAT11(sVar24,sVar25);
                          lVar31 = lVar31 + 1;
                        } while (uVar41 != (uint)lVar31);
                      }
                    }
                    else if (sVar23 == 0x10) {
                      if (0 < (int)uVar41) {
                        lVar31 = 0;
                        do {
                          sVar24 = stbi__get8(s);
                          stbi__get8(s);
                          auVar136 = _DAT_00112a30;
                          *(stbi_uc *)(psVar40 + lVar31 * 2) = sVar24;
                          lVar31 = lVar31 + 1;
                        } while (uVar41 != (uint)lVar31);
                      }
                    }
                    else if (0 < (int)uVar41) {
                      lVar31 = 0;
                      do {
                        sVar24 = stbi__get8(s);
                        auVar136 = _DAT_00112a30;
                        *(stbi_uc *)(psVar40 + lVar31 * 2) = sVar24;
                        lVar31 = lVar31 + 1;
                      } while (uVar41 != (uint)lVar31);
                    }
                  }
                  else if (sVar23 == 0x10 && bpc == 0x10) {
                    if (0 < (int)uVar41) {
                      sVar28 = -(ushort)(uVar32 == 3);
                      uVar34 = 0;
                      do {
                        auVar48._8_4_ = (int)uVar34;
                        auVar48._0_8_ = uVar34;
                        auVar48._12_4_ = (int)(uVar34 >> 0x20);
                        auVar57 = auVar51 ^ auVar136;
                        auVar137 = (auVar48 | _DAT_00112ac0) ^ auVar136;
                        iVar33 = auVar57._0_4_;
                        iVar117 = -(uint)(iVar33 < auVar137._0_4_);
                        iVar39 = auVar57._4_4_;
                        auVar76._4_4_ = -(uint)(iVar39 < auVar137._4_4_);
                        iVar55 = auVar57._8_4_;
                        iVar126 = -(uint)(iVar55 < auVar137._8_4_);
                        iVar56 = auVar57._12_4_;
                        auVar76._12_4_ = -(uint)(iVar56 < auVar137._12_4_);
                        auVar105._4_4_ = iVar117;
                        auVar105._0_4_ = iVar117;
                        auVar105._8_4_ = iVar126;
                        auVar105._12_4_ = iVar126;
                        auVar57 = pshuflw(in_XMM5,auVar105,0xe8);
                        auVar75._4_4_ = -(uint)(auVar137._4_4_ == iVar39);
                        auVar75._12_4_ = -(uint)(auVar137._12_4_ == iVar56);
                        auVar75._0_4_ = auVar75._4_4_;
                        auVar75._8_4_ = auVar75._12_4_;
                        auVar61 = pshuflw(in_XMM6,auVar75,0xe8);
                        auVar76._0_4_ = auVar76._4_4_;
                        auVar76._8_4_ = auVar76._12_4_;
                        auVar137 = pshuflw(auVar57,auVar76,0xe8);
                        auVar131._8_4_ = 0xffffffff;
                        auVar131._0_8_ = 0xffffffffffffffff;
                        auVar131._12_4_ = 0xffffffff;
                        auVar131 = (auVar137 | auVar61 & auVar57) ^ auVar131;
                        auVar137 = packssdw(auVar131,auVar131);
                        if ((auVar137 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          psVar44[uVar34 * 4 + -0x1c] = sVar28;
                        }
                        auVar76 = auVar75 & auVar105 | auVar76;
                        auVar137 = packssdw(auVar76,auVar76);
                        auVar11._8_4_ = 0xffffffff;
                        auVar11._0_8_ = 0xffffffffffffffff;
                        auVar11._12_4_ = 0xffffffff;
                        auVar137 = packssdw(auVar137 ^ auVar11,auVar137 ^ auVar11);
                        if ((auVar137._0_4_ >> 0x10 & 1) != 0) {
                          psVar44[uVar34 * 4 + -0x18] = sVar28;
                        }
                        auVar137 = (auVar48 | _DAT_00112ab0) ^ auVar136;
                        iVar117 = -(uint)(iVar33 < auVar137._0_4_);
                        auVar122._4_4_ = -(uint)(iVar39 < auVar137._4_4_);
                        iVar126 = -(uint)(iVar55 < auVar137._8_4_);
                        auVar122._12_4_ = -(uint)(iVar56 < auVar137._12_4_);
                        auVar77._4_4_ = iVar117;
                        auVar77._0_4_ = iVar117;
                        auVar77._8_4_ = iVar126;
                        auVar77._12_4_ = iVar126;
                        auVar106._4_4_ = -(uint)(auVar137._4_4_ == iVar39);
                        auVar106._12_4_ = -(uint)(auVar137._12_4_ == iVar56);
                        auVar106._0_4_ = auVar106._4_4_;
                        auVar106._8_4_ = auVar106._12_4_;
                        auVar122._0_4_ = auVar122._4_4_;
                        auVar122._8_4_ = auVar122._12_4_;
                        auVar137 = auVar106 & auVar77 | auVar122;
                        auVar137 = packssdw(auVar137,auVar137);
                        auVar12._8_4_ = 0xffffffff;
                        auVar12._0_8_ = 0xffffffffffffffff;
                        auVar12._12_4_ = 0xffffffff;
                        auVar137 = packssdw(auVar137 ^ auVar12,auVar137 ^ auVar12);
                        if ((auVar137 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                          psVar44[uVar34 * 4 + -0x14] = sVar28;
                        }
                        auVar62 = pshufhw(auVar77,auVar77,0x84);
                        auVar107 = pshufhw(auVar106,auVar106,0x84);
                        auVar98 = pshufhw(auVar62,auVar122,0x84);
                        auVar78._8_4_ = 0xffffffff;
                        auVar78._0_8_ = 0xffffffffffffffff;
                        auVar78._12_4_ = 0xffffffff;
                        auVar78 = (auVar98 | auVar107 & auVar62) ^ auVar78;
                        auVar62 = packssdw(auVar78,auVar78);
                        if ((auVar62 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0)
                        {
                          psVar44[uVar34 * 4 + -0x10] = sVar28;
                        }
                        auVar62 = (auVar48 | _DAT_00112aa0) ^ auVar136;
                        iVar117 = -(uint)(iVar33 < auVar62._0_4_);
                        auVar80._4_4_ = -(uint)(iVar39 < auVar62._4_4_);
                        iVar126 = -(uint)(iVar55 < auVar62._8_4_);
                        auVar80._12_4_ = -(uint)(iVar56 < auVar62._12_4_);
                        auVar108._4_4_ = iVar117;
                        auVar108._0_4_ = iVar117;
                        auVar108._8_4_ = iVar126;
                        auVar108._12_4_ = iVar126;
                        auVar137 = pshuflw(auVar137,auVar108,0xe8);
                        auVar79._4_4_ = -(uint)(auVar62._4_4_ == iVar39);
                        auVar79._12_4_ = -(uint)(auVar62._12_4_ == iVar56);
                        auVar79._0_4_ = auVar79._4_4_;
                        auVar79._8_4_ = auVar79._12_4_;
                        in_XMM6 = pshuflw(auVar61 & auVar57,auVar79,0xe8);
                        in_XMM6 = in_XMM6 & auVar137;
                        auVar80._0_4_ = auVar80._4_4_;
                        auVar80._8_4_ = auVar80._12_4_;
                        auVar57 = pshuflw(auVar137,auVar80,0xe8);
                        auVar132._8_4_ = 0xffffffff;
                        auVar132._0_8_ = 0xffffffffffffffff;
                        auVar132._12_4_ = 0xffffffff;
                        auVar132 = (auVar57 | in_XMM6) ^ auVar132;
                        in_XMM5 = packssdw(auVar132,auVar132);
                        if ((in_XMM5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          psVar44[uVar34 * 4 + -0xc] = sVar28;
                        }
                        auVar80 = auVar79 & auVar108 | auVar80;
                        auVar57 = packssdw(auVar80,auVar80);
                        auVar13._8_4_ = 0xffffffff;
                        auVar13._0_8_ = 0xffffffffffffffff;
                        auVar13._12_4_ = 0xffffffff;
                        auVar57 = packssdw(auVar57 ^ auVar13,auVar57 ^ auVar13);
                        if ((auVar57 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                          psVar44[uVar34 * 4 + -8] = sVar28;
                        }
                        auVar57 = (auVar48 | _DAT_00112a90) ^ auVar136;
                        auVar109._0_4_ = -(uint)(iVar33 < auVar57._0_4_);
                        auVar109._4_4_ = -(uint)(iVar39 < auVar57._4_4_);
                        auVar109._8_4_ = -(uint)(iVar55 < auVar57._8_4_);
                        auVar109._12_4_ = -(uint)(iVar56 < auVar57._12_4_);
                        auVar81._4_4_ = auVar109._0_4_;
                        auVar81._0_4_ = auVar109._0_4_;
                        auVar81._8_4_ = auVar109._8_4_;
                        auVar81._12_4_ = auVar109._8_4_;
                        auVar49._4_4_ = -(uint)(auVar57._4_4_ == iVar39);
                        auVar49._12_4_ = -(uint)(auVar57._12_4_ == iVar56);
                        auVar49._0_4_ = auVar49._4_4_;
                        auVar49._8_4_ = auVar49._12_4_;
                        auVar53._4_4_ = auVar109._4_4_;
                        auVar53._0_4_ = auVar109._4_4_;
                        auVar53._8_4_ = auVar109._12_4_;
                        auVar53._12_4_ = auVar109._12_4_;
                        auVar57 = packssdw(auVar109,auVar49 & auVar81 | auVar53);
                        auVar14._8_4_ = 0xffffffff;
                        auVar14._0_8_ = 0xffffffffffffffff;
                        auVar14._12_4_ = 0xffffffff;
                        auVar57 = packssdw(auVar57 ^ auVar14,auVar57 ^ auVar14);
                        if ((auVar57 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                          psVar44[uVar34 * 4 + -4] = sVar28;
                        }
                        auVar61 = pshufhw(auVar81,auVar81,0x84);
                        auVar57 = pshufhw(auVar49,auVar49,0x84);
                        auVar137 = pshufhw(auVar53,auVar53,0x84);
                        auVar15._8_4_ = 0xffffffff;
                        auVar15._0_8_ = 0xffffffffffffffff;
                        auVar15._12_4_ = 0xffffffff;
                        auVar57 = packssdw(auVar57 & auVar61,
                                           (auVar137 | auVar57 & auVar61) ^ auVar15);
                        if ((auVar57 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0)
                        {
                          psVar44[uVar34 * 4] = sVar28;
                        }
                        uVar34 = uVar34 + 8;
                      } while ((uVar41 + 7 & 0xfffffff8) != uVar34);
                    }
                  }
                  else if (0 < (int)uVar41) {
                    cVar27 = -(uVar32 == 3);
                    uVar34 = 0;
                    do {
                      auVar137._8_4_ = (int)uVar34;
                      auVar137._0_8_ = uVar34;
                      auVar137._12_4_ = (int)(uVar34 >> 0x20);
                      auVar57 = auVar51 ^ auVar136;
                      auVar61 = (auVar137 | _DAT_00112ac0) ^ auVar136;
                      iVar33 = auVar57._0_4_;
                      iVar117 = -(uint)(iVar33 < auVar61._0_4_);
                      iVar39 = auVar57._4_4_;
                      auVar98._4_4_ = -(uint)(iVar39 < auVar61._4_4_);
                      iVar55 = auVar57._8_4_;
                      iVar126 = -(uint)(iVar55 < auVar61._8_4_);
                      iVar56 = auVar57._12_4_;
                      auVar98._12_4_ = -(uint)(iVar56 < auVar61._12_4_);
                      auVar107._4_4_ = iVar117;
                      auVar107._0_4_ = iVar117;
                      auVar107._8_4_ = iVar126;
                      auVar107._12_4_ = iVar126;
                      auVar133 = pshuflw(in_XMM5,auVar107,0xe8);
                      auVar62._4_4_ = -(uint)(auVar61._4_4_ == iVar39);
                      auVar62._12_4_ = -(uint)(auVar61._12_4_ == iVar56);
                      auVar62._0_4_ = auVar62._4_4_;
                      auVar62._8_4_ = auVar62._12_4_;
                      auVar138 = pshuflw(in_XMM6,auVar62,0xe8);
                      auVar98._0_4_ = auVar98._4_4_;
                      auVar98._8_4_ = auVar98._12_4_;
                      auVar61 = pshuflw(auVar133,auVar98,0xe8);
                      auVar57._8_4_ = 0xffffffff;
                      auVar57._0_8_ = 0xffffffffffffffff;
                      auVar57._12_4_ = 0xffffffff;
                      auVar57 = (auVar61 | auVar138 & auVar133) ^ auVar57;
                      auVar57 = packssdw(auVar57,auVar57);
                      if ((auVar57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(char *)(psVar43 + uVar34 * 2 + -0x1e) = cVar27;
                      }
                      auVar98 = auVar62 & auVar107 | auVar98;
                      auVar57 = packssdw(auVar98,auVar98);
                      auVar61._8_4_ = 0xffffffff;
                      auVar61._0_8_ = 0xffffffffffffffff;
                      auVar61._12_4_ = 0xffffffff;
                      auVar57 = packssdw(auVar57 ^ auVar61,auVar57 ^ auVar61);
                      auVar57 = packsswb(auVar57,auVar57);
                      if ((auVar57._0_4_ >> 8 & 1) != 0) {
                        *(char *)(psVar43 + uVar34 * 2 + -0x1c) = cVar27;
                      }
                      auVar57 = (auVar137 | _DAT_00112ab0) ^ auVar136;
                      iVar117 = -(uint)(iVar33 < auVar57._0_4_);
                      auVar123._4_4_ = -(uint)(iVar39 < auVar57._4_4_);
                      iVar126 = -(uint)(iVar55 < auVar57._8_4_);
                      auVar123._12_4_ = -(uint)(iVar56 < auVar57._12_4_);
                      auVar82._4_4_ = iVar117;
                      auVar82._0_4_ = iVar117;
                      auVar82._8_4_ = iVar126;
                      auVar82._12_4_ = iVar126;
                      auVar110._4_4_ = -(uint)(auVar57._4_4_ == iVar39);
                      auVar110._12_4_ = -(uint)(auVar57._12_4_ == iVar56);
                      auVar110._0_4_ = auVar110._4_4_;
                      auVar110._8_4_ = auVar110._12_4_;
                      auVar123._0_4_ = auVar123._4_4_;
                      auVar123._8_4_ = auVar123._12_4_;
                      auVar57 = auVar110 & auVar82 | auVar123;
                      auVar57 = packssdw(auVar57,auVar57);
                      auVar16._8_4_ = 0xffffffff;
                      auVar16._0_8_ = 0xffffffffffffffff;
                      auVar16._12_4_ = 0xffffffff;
                      auVar57 = packssdw(auVar57 ^ auVar16,auVar57 ^ auVar16);
                      auVar57 = packsswb(auVar57,auVar57);
                      if ((auVar57._0_4_ >> 0x10 & 1) != 0) {
                        *(char *)(psVar43 + uVar34 * 2 + -0x1a) = cVar27;
                      }
                      auVar61 = pshufhw(auVar82,auVar82,0x84);
                      auVar98 = pshufhw(auVar110,auVar110,0x84);
                      auVar62 = pshufhw(auVar61,auVar123,0x84);
                      auVar83._8_4_ = 0xffffffff;
                      auVar83._0_8_ = 0xffffffffffffffff;
                      auVar83._12_4_ = 0xffffffff;
                      auVar83 = (auVar62 | auVar98 & auVar61) ^ auVar83;
                      auVar61 = packssdw(auVar83,auVar83);
                      auVar61 = packsswb(auVar61,auVar61);
                      if ((auVar61._0_4_ >> 0x18 & 1) != 0) {
                        *(char *)(psVar43 + uVar34 * 2 + -0x18) = cVar27;
                      }
                      auVar61 = (auVar137 | _DAT_00112aa0) ^ auVar136;
                      iVar117 = -(uint)(iVar33 < auVar61._0_4_);
                      auVar85._4_4_ = -(uint)(iVar39 < auVar61._4_4_);
                      iVar126 = -(uint)(iVar55 < auVar61._8_4_);
                      auVar85._12_4_ = -(uint)(iVar56 < auVar61._12_4_);
                      auVar111._4_4_ = iVar117;
                      auVar111._0_4_ = iVar117;
                      auVar111._8_4_ = iVar126;
                      auVar111._12_4_ = iVar126;
                      auVar57 = pshuflw(auVar57,auVar111,0xe8);
                      auVar84._4_4_ = -(uint)(auVar61._4_4_ == iVar39);
                      auVar84._12_4_ = -(uint)(auVar61._12_4_ == iVar56);
                      auVar84._0_4_ = auVar84._4_4_;
                      auVar84._8_4_ = auVar84._12_4_;
                      auVar62 = pshuflw(auVar138 & auVar133,auVar84,0xe8);
                      auVar85._0_4_ = auVar85._4_4_;
                      auVar85._8_4_ = auVar85._12_4_;
                      auVar61 = pshuflw(auVar57,auVar85,0xe8);
                      auVar133._8_4_ = 0xffffffff;
                      auVar133._0_8_ = 0xffffffffffffffff;
                      auVar133._12_4_ = 0xffffffff;
                      auVar133 = (auVar61 | auVar62 & auVar57) ^ auVar133;
                      auVar61 = packssdw(auVar133,auVar133);
                      auVar61 = packsswb(auVar61,auVar61);
                      if ((auVar61 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        *(char *)(psVar43 + uVar34 * 2 + -0x16) = cVar27;
                      }
                      auVar85 = auVar84 & auVar111 | auVar85;
                      auVar61 = packssdw(auVar85,auVar85);
                      auVar138._8_4_ = 0xffffffff;
                      auVar138._0_8_ = 0xffffffffffffffff;
                      auVar138._12_4_ = 0xffffffff;
                      auVar61 = packssdw(auVar61 ^ auVar138,auVar61 ^ auVar138);
                      auVar61 = packsswb(auVar61,auVar61);
                      if ((auVar61._4_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar43 + uVar34 * 2 + -0x14) = cVar27;
                      }
                      auVar61 = (auVar137 | _DAT_00112a90) ^ auVar136;
                      iVar117 = -(uint)(iVar33 < auVar61._0_4_);
                      auVar124._4_4_ = -(uint)(iVar39 < auVar61._4_4_);
                      iVar126 = -(uint)(iVar55 < auVar61._8_4_);
                      auVar124._12_4_ = -(uint)(iVar56 < auVar61._12_4_);
                      auVar86._4_4_ = iVar117;
                      auVar86._0_4_ = iVar117;
                      auVar86._8_4_ = iVar126;
                      auVar86._12_4_ = iVar126;
                      auVar112._4_4_ = -(uint)(auVar61._4_4_ == iVar39);
                      auVar112._12_4_ = -(uint)(auVar61._12_4_ == iVar56);
                      auVar112._0_4_ = auVar112._4_4_;
                      auVar112._8_4_ = auVar112._12_4_;
                      auVar124._0_4_ = auVar124._4_4_;
                      auVar124._8_4_ = auVar124._12_4_;
                      auVar61 = auVar112 & auVar86 | auVar124;
                      auVar61 = packssdw(auVar61,auVar61);
                      auVar17._8_4_ = 0xffffffff;
                      auVar17._0_8_ = 0xffffffffffffffff;
                      auVar17._12_4_ = 0xffffffff;
                      auVar61 = packssdw(auVar61 ^ auVar17,auVar61 ^ auVar17);
                      auVar61 = packsswb(auVar61,auVar61);
                      if ((auVar61 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        *(char *)(psVar43 + uVar34 * 2 + -0x12) = cVar27;
                      }
                      auVar98 = pshufhw(auVar86,auVar86,0x84);
                      auVar133 = pshufhw(auVar112,auVar112,0x84);
                      auVar107 = pshufhw(auVar98,auVar124,0x84);
                      auVar87._8_4_ = 0xffffffff;
                      auVar87._0_8_ = 0xffffffffffffffff;
                      auVar87._12_4_ = 0xffffffff;
                      auVar87 = (auVar107 | auVar133 & auVar98) ^ auVar87;
                      auVar98 = packssdw(auVar87,auVar87);
                      auVar98 = packsswb(auVar98,auVar98);
                      if ((auVar98._6_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar43 + uVar34 * 2 + -0x10) = cVar27;
                      }
                      auVar98 = (auVar137 | _DAT_00112a80) ^ auVar136;
                      iVar117 = -(uint)(iVar33 < auVar98._0_4_);
                      auVar89._4_4_ = -(uint)(iVar39 < auVar98._4_4_);
                      iVar126 = -(uint)(iVar55 < auVar98._8_4_);
                      auVar89._12_4_ = -(uint)(iVar56 < auVar98._12_4_);
                      auVar113._4_4_ = iVar117;
                      auVar113._0_4_ = iVar117;
                      auVar113._8_4_ = iVar126;
                      auVar113._12_4_ = iVar126;
                      auVar61 = pshuflw(auVar61,auVar113,0xe8);
                      auVar88._4_4_ = -(uint)(auVar98._4_4_ == iVar39);
                      auVar88._12_4_ = -(uint)(auVar98._12_4_ == iVar56);
                      auVar88._0_4_ = auVar88._4_4_;
                      auVar88._8_4_ = auVar88._12_4_;
                      auVar62 = pshuflw(auVar62 & auVar57,auVar88,0xe8);
                      auVar89._0_4_ = auVar89._4_4_;
                      auVar89._8_4_ = auVar89._12_4_;
                      auVar57 = pshuflw(auVar61,auVar89,0xe8);
                      auVar134._8_4_ = 0xffffffff;
                      auVar134._0_8_ = 0xffffffffffffffff;
                      auVar134._12_4_ = 0xffffffff;
                      auVar134 = (auVar57 | auVar62 & auVar61) ^ auVar134;
                      auVar57 = packssdw(auVar134,auVar134);
                      auVar57 = packsswb(auVar57,auVar57);
                      if ((auVar57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(char *)(psVar43 + uVar34 * 2 + -0xe) = cVar27;
                      }
                      auVar89 = auVar88 & auVar113 | auVar89;
                      auVar57 = packssdw(auVar89,auVar89);
                      auVar18._8_4_ = 0xffffffff;
                      auVar18._0_8_ = 0xffffffffffffffff;
                      auVar18._12_4_ = 0xffffffff;
                      auVar57 = packssdw(auVar57 ^ auVar18,auVar57 ^ auVar18);
                      auVar57 = packsswb(auVar57,auVar57);
                      if ((auVar57._8_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar43 + uVar34 * 2 + -0xc) = cVar27;
                      }
                      auVar57 = (auVar137 | _DAT_00112a70) ^ auVar136;
                      iVar117 = -(uint)(iVar33 < auVar57._0_4_);
                      auVar125._4_4_ = -(uint)(iVar39 < auVar57._4_4_);
                      iVar126 = -(uint)(iVar55 < auVar57._8_4_);
                      auVar125._12_4_ = -(uint)(iVar56 < auVar57._12_4_);
                      auVar90._4_4_ = iVar117;
                      auVar90._0_4_ = iVar117;
                      auVar90._8_4_ = iVar126;
                      auVar90._12_4_ = iVar126;
                      auVar114._4_4_ = -(uint)(auVar57._4_4_ == iVar39);
                      auVar114._12_4_ = -(uint)(auVar57._12_4_ == iVar56);
                      auVar114._0_4_ = auVar114._4_4_;
                      auVar114._8_4_ = auVar114._12_4_;
                      auVar125._0_4_ = auVar125._4_4_;
                      auVar125._8_4_ = auVar125._12_4_;
                      auVar57 = auVar114 & auVar90 | auVar125;
                      auVar57 = packssdw(auVar57,auVar57);
                      auVar19._8_4_ = 0xffffffff;
                      auVar19._0_8_ = 0xffffffffffffffff;
                      auVar19._12_4_ = 0xffffffff;
                      auVar57 = packssdw(auVar57 ^ auVar19,auVar57 ^ auVar19);
                      auVar57 = packsswb(auVar57,auVar57);
                      if ((auVar57 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                        *(char *)(psVar43 + uVar34 * 2 + -10) = cVar27;
                      }
                      auVar98 = pshufhw(auVar90,auVar90,0x84);
                      auVar133 = pshufhw(auVar114,auVar114,0x84);
                      auVar107 = pshufhw(auVar98,auVar125,0x84);
                      auVar91._8_4_ = 0xffffffff;
                      auVar91._0_8_ = 0xffffffffffffffff;
                      auVar91._12_4_ = 0xffffffff;
                      auVar91 = (auVar107 | auVar133 & auVar98) ^ auVar91;
                      auVar98 = packssdw(auVar91,auVar91);
                      auVar98 = packsswb(auVar98,auVar98);
                      if ((auVar98._10_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar43 + uVar34 * 2 + -8) = cVar27;
                      }
                      auVar98 = (auVar137 | _DAT_00112a60) ^ auVar136;
                      iVar117 = -(uint)(iVar33 < auVar98._0_4_);
                      auVar93._4_4_ = -(uint)(iVar39 < auVar98._4_4_);
                      iVar126 = -(uint)(iVar55 < auVar98._8_4_);
                      auVar93._12_4_ = -(uint)(iVar56 < auVar98._12_4_);
                      auVar115._4_4_ = iVar117;
                      auVar115._0_4_ = iVar117;
                      auVar115._8_4_ = iVar126;
                      auVar115._12_4_ = iVar126;
                      auVar57 = pshuflw(auVar57,auVar115,0xe8);
                      auVar92._4_4_ = -(uint)(auVar98._4_4_ == iVar39);
                      auVar92._12_4_ = -(uint)(auVar98._12_4_ == iVar56);
                      auVar92._0_4_ = auVar92._4_4_;
                      auVar92._8_4_ = auVar92._12_4_;
                      in_XMM6 = pshuflw(auVar62 & auVar61,auVar92,0xe8);
                      in_XMM6 = in_XMM6 & auVar57;
                      auVar93._0_4_ = auVar93._4_4_;
                      auVar93._8_4_ = auVar93._12_4_;
                      auVar57 = pshuflw(auVar57,auVar93,0xe8);
                      auVar135._8_4_ = 0xffffffff;
                      auVar135._0_8_ = 0xffffffffffffffff;
                      auVar135._12_4_ = 0xffffffff;
                      auVar135 = (auVar57 | in_XMM6) ^ auVar135;
                      auVar57 = packssdw(auVar135,auVar135);
                      in_XMM5 = packsswb(auVar57,auVar57);
                      if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        *(char *)(psVar43 + uVar34 * 2 + -6) = cVar27;
                      }
                      auVar93 = auVar92 & auVar115 | auVar93;
                      auVar57 = packssdw(auVar93,auVar93);
                      auVar20._8_4_ = 0xffffffff;
                      auVar20._0_8_ = 0xffffffffffffffff;
                      auVar20._12_4_ = 0xffffffff;
                      auVar57 = packssdw(auVar57 ^ auVar20,auVar57 ^ auVar20);
                      auVar57 = packsswb(auVar57,auVar57);
                      if ((auVar57._12_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar43 + uVar34 * 2 + -4) = cVar27;
                      }
                      auVar57 = (auVar137 | _DAT_00112a50) ^ auVar136;
                      auVar116._0_4_ = -(uint)(iVar33 < auVar57._0_4_);
                      auVar116._4_4_ = -(uint)(iVar39 < auVar57._4_4_);
                      auVar116._8_4_ = -(uint)(iVar55 < auVar57._8_4_);
                      auVar116._12_4_ = -(uint)(iVar56 < auVar57._12_4_);
                      auVar94._4_4_ = auVar116._0_4_;
                      auVar94._0_4_ = auVar116._0_4_;
                      auVar94._8_4_ = auVar116._8_4_;
                      auVar94._12_4_ = auVar116._8_4_;
                      auVar50._4_4_ = -(uint)(auVar57._4_4_ == iVar39);
                      auVar50._12_4_ = -(uint)(auVar57._12_4_ == iVar56);
                      auVar50._0_4_ = auVar50._4_4_;
                      auVar50._8_4_ = auVar50._12_4_;
                      auVar54._4_4_ = auVar116._4_4_;
                      auVar54._0_4_ = auVar116._4_4_;
                      auVar54._8_4_ = auVar116._12_4_;
                      auVar54._12_4_ = auVar116._12_4_;
                      auVar57 = packssdw(auVar116,auVar50 & auVar94 | auVar54);
                      auVar21._8_4_ = 0xffffffff;
                      auVar21._0_8_ = 0xffffffffffffffff;
                      auVar21._12_4_ = 0xffffffff;
                      auVar57 = packssdw(auVar57 ^ auVar21,auVar57 ^ auVar21);
                      auVar57 = packsswb(auVar57,auVar57);
                      if ((auVar57 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        *(char *)(psVar43 + uVar34 * 2 + -2) = cVar27;
                      }
                      auVar61 = pshufhw(auVar94,auVar94,0x84);
                      auVar57 = pshufhw(auVar50,auVar50,0x84);
                      auVar137 = pshufhw(auVar54,auVar54,0x84);
                      auVar22._8_4_ = 0xffffffff;
                      auVar22._0_8_ = 0xffffffffffffffff;
                      auVar22._12_4_ = 0xffffffff;
                      auVar57 = packssdw(auVar57 & auVar61,(auVar137 | auVar57 & auVar61) ^ auVar22)
                      ;
                      auVar57 = packsswb(auVar57,auVar57);
                      if ((auVar57._14_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar43 + uVar34 * 2) = cVar27;
                      }
                      uVar34 = uVar34 + 0x10;
                    } while ((uVar41 + 0xf & 0xfffffff0) != uVar34);
                  }
                  uVar32 = uVar32 + 1;
                  psVar43 = (stbi__uint16 *)((long)psVar43 + 1);
                  psVar44 = psVar44 + 1;
                  psVar40 = (stbi__uint16 *)((long)psVar40 + 1);
                  local_80 = local_80 + 1;
                } while (uVar32 != 4);
              }
              else {
                stbi__skip(s,bVar26 * sVar29 * 2);
                lVar31 = uVar42 - 1;
                auVar45._8_4_ = (int)lVar31;
                auVar45._0_8_ = lVar31;
                auVar45._12_4_ = (int)((ulong)lVar31 >> 0x20);
                psVar43 = data + 0x1e;
                uVar32 = 0;
                auVar136 = _DAT_00112a30;
                do {
                  if (uVar32 < uVar35) {
                    if (0 < (int)uVar41) {
                      psVar37 = (stbi_uc *)((long)data + uVar32);
                      iVar33 = 0;
                      uVar34 = uVar42;
                      do {
                        bVar26 = stbi__get8(s);
                        if (bVar26 != 0x80) {
                          uVar36 = (uint)bVar26;
                          if ((char)bVar26 < '\0') {
                            uVar38 = 0x101 - uVar36;
                            if ((uint)uVar34 < uVar38) goto LAB_00109d53;
                            sVar24 = stbi__get8(s);
                            iVar39 = uVar36 - 0x101;
                            do {
                              *psVar37 = sVar24;
                              psVar37 = psVar37 + 4;
                              iVar39 = iVar39 + 1;
                            } while (iVar39 != 0);
                          }
                          else {
                            if ((uint)uVar34 <= (uint)bVar26) {
LAB_00109d53:
                              free(data);
                              stbi__g_failure_reason = "corrupt";
                              return (void *)0x0;
                            }
                            uVar38 = uVar36 + 1;
                            uVar36 = uVar38;
                            do {
                              sVar24 = stbi__get8(s);
                              *psVar37 = sVar24;
                              psVar37 = psVar37 + 4;
                              uVar36 = uVar36 - 1;
                            } while (uVar36 != 0);
                          }
                          iVar33 = iVar33 + uVar38;
                        }
                        uVar34 = (ulong)(uVar41 - iVar33);
                        auVar136 = _DAT_00112a30;
                      } while (uVar41 - iVar33 != 0 && iVar33 <= (int)uVar41);
                    }
                  }
                  else if (0 < (int)uVar41) {
                    cVar27 = -(uVar32 == 3);
                    uVar34 = 0;
                    do {
                      auVar46._8_4_ = (int)uVar34;
                      auVar46._0_8_ = uVar34;
                      auVar46._12_4_ = (int)(uVar34 >> 0x20);
                      auVar51 = auVar45 ^ auVar136;
                      auVar57 = (auVar46 | _DAT_00112ac0) ^ auVar136;
                      iVar33 = auVar51._0_4_;
                      iVar117 = -(uint)(iVar33 < auVar57._0_4_);
                      iVar39 = auVar51._4_4_;
                      auVar59._4_4_ = -(uint)(iVar39 < auVar57._4_4_);
                      iVar55 = auVar51._8_4_;
                      iVar126 = -(uint)(iVar55 < auVar57._8_4_);
                      iVar56 = auVar51._12_4_;
                      auVar59._12_4_ = -(uint)(iVar56 < auVar57._12_4_);
                      auVar96._4_4_ = iVar117;
                      auVar96._0_4_ = iVar117;
                      auVar96._8_4_ = iVar126;
                      auVar96._12_4_ = iVar126;
                      auVar51 = pshuflw(in_XMM5,auVar96,0xe8);
                      auVar58._4_4_ = -(uint)(auVar57._4_4_ == iVar39);
                      auVar58._12_4_ = -(uint)(auVar57._12_4_ == iVar56);
                      auVar58._0_4_ = auVar58._4_4_;
                      auVar58._8_4_ = auVar58._12_4_;
                      auVar137 = pshuflw(in_XMM6,auVar58,0xe8);
                      auVar59._0_4_ = auVar59._4_4_;
                      auVar59._8_4_ = auVar59._12_4_;
                      auVar57 = pshuflw(auVar51,auVar59,0xe8);
                      auVar127._8_4_ = 0xffffffff;
                      auVar127._0_8_ = 0xffffffffffffffff;
                      auVar127._12_4_ = 0xffffffff;
                      auVar127 = (auVar57 | auVar137 & auVar51) ^ auVar127;
                      auVar57 = packssdw(auVar127,auVar127);
                      if ((auVar57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(char *)(psVar43 + uVar34 * 2 + -0x1e) = cVar27;
                      }
                      auVar59 = auVar58 & auVar96 | auVar59;
                      auVar57 = packssdw(auVar59,auVar59);
                      auVar2._8_4_ = 0xffffffff;
                      auVar2._0_8_ = 0xffffffffffffffff;
                      auVar2._12_4_ = 0xffffffff;
                      auVar57 = packssdw(auVar57 ^ auVar2,auVar57 ^ auVar2);
                      auVar57 = packsswb(auVar57,auVar57);
                      if ((auVar57._0_4_ >> 8 & 1) != 0) {
                        *(char *)(psVar43 + uVar34 * 2 + -0x1c) = cVar27;
                      }
                      auVar57 = (auVar46 | _DAT_00112ab0) ^ auVar136;
                      iVar117 = -(uint)(iVar33 < auVar57._0_4_);
                      auVar119._4_4_ = -(uint)(iVar39 < auVar57._4_4_);
                      iVar126 = -(uint)(iVar55 < auVar57._8_4_);
                      auVar119._12_4_ = -(uint)(iVar56 < auVar57._12_4_);
                      auVar60._4_4_ = iVar117;
                      auVar60._0_4_ = iVar117;
                      auVar60._8_4_ = iVar126;
                      auVar60._12_4_ = iVar126;
                      auVar97._4_4_ = -(uint)(auVar57._4_4_ == iVar39);
                      auVar97._12_4_ = -(uint)(auVar57._12_4_ == iVar56);
                      auVar97._0_4_ = auVar97._4_4_;
                      auVar97._8_4_ = auVar97._12_4_;
                      auVar119._0_4_ = auVar119._4_4_;
                      auVar119._8_4_ = auVar119._12_4_;
                      auVar57 = auVar97 & auVar60 | auVar119;
                      auVar57 = packssdw(auVar57,auVar57);
                      auVar3._8_4_ = 0xffffffff;
                      auVar3._0_8_ = 0xffffffffffffffff;
                      auVar3._12_4_ = 0xffffffff;
                      auVar57 = packssdw(auVar57 ^ auVar3,auVar57 ^ auVar3);
                      auVar57 = packsswb(auVar57,auVar57);
                      if ((auVar57._0_4_ >> 0x10 & 1) != 0) {
                        *(char *)(psVar43 + uVar34 * 2 + -0x1a) = cVar27;
                      }
                      auVar61 = pshufhw(auVar60,auVar60,0x84);
                      auVar98 = pshufhw(auVar97,auVar97,0x84);
                      auVar62 = pshufhw(auVar61,auVar119,0x84);
                      auVar63._8_4_ = 0xffffffff;
                      auVar63._0_8_ = 0xffffffffffffffff;
                      auVar63._12_4_ = 0xffffffff;
                      auVar63 = (auVar62 | auVar98 & auVar61) ^ auVar63;
                      auVar61 = packssdw(auVar63,auVar63);
                      auVar61 = packsswb(auVar61,auVar61);
                      if ((auVar61._0_4_ >> 0x18 & 1) != 0) {
                        *(char *)(psVar43 + uVar34 * 2 + -0x18) = cVar27;
                      }
                      auVar61 = (auVar46 | _DAT_00112aa0) ^ auVar136;
                      iVar117 = -(uint)(iVar33 < auVar61._0_4_);
                      auVar65._4_4_ = -(uint)(iVar39 < auVar61._4_4_);
                      iVar126 = -(uint)(iVar55 < auVar61._8_4_);
                      auVar65._12_4_ = -(uint)(iVar56 < auVar61._12_4_);
                      auVar99._4_4_ = iVar117;
                      auVar99._0_4_ = iVar117;
                      auVar99._8_4_ = iVar126;
                      auVar99._12_4_ = iVar126;
                      auVar57 = pshuflw(auVar57,auVar99,0xe8);
                      auVar64._4_4_ = -(uint)(auVar61._4_4_ == iVar39);
                      auVar64._12_4_ = -(uint)(auVar61._12_4_ == iVar56);
                      auVar64._0_4_ = auVar64._4_4_;
                      auVar64._8_4_ = auVar64._12_4_;
                      auVar137 = pshuflw(auVar137 & auVar51,auVar64,0xe8);
                      auVar65._0_4_ = auVar65._4_4_;
                      auVar65._8_4_ = auVar65._12_4_;
                      auVar51 = pshuflw(auVar57,auVar65,0xe8);
                      auVar128._8_4_ = 0xffffffff;
                      auVar128._0_8_ = 0xffffffffffffffff;
                      auVar128._12_4_ = 0xffffffff;
                      auVar128 = (auVar51 | auVar137 & auVar57) ^ auVar128;
                      auVar51 = packssdw(auVar128,auVar128);
                      auVar51 = packsswb(auVar51,auVar51);
                      if ((auVar51 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        *(char *)(psVar43 + uVar34 * 2 + -0x16) = cVar27;
                      }
                      auVar65 = auVar64 & auVar99 | auVar65;
                      auVar51 = packssdw(auVar65,auVar65);
                      auVar4._8_4_ = 0xffffffff;
                      auVar4._0_8_ = 0xffffffffffffffff;
                      auVar4._12_4_ = 0xffffffff;
                      auVar51 = packssdw(auVar51 ^ auVar4,auVar51 ^ auVar4);
                      auVar51 = packsswb(auVar51,auVar51);
                      if ((auVar51._4_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar43 + uVar34 * 2 + -0x14) = cVar27;
                      }
                      auVar51 = (auVar46 | _DAT_00112a90) ^ auVar136;
                      iVar117 = -(uint)(iVar33 < auVar51._0_4_);
                      auVar120._4_4_ = -(uint)(iVar39 < auVar51._4_4_);
                      iVar126 = -(uint)(iVar55 < auVar51._8_4_);
                      auVar120._12_4_ = -(uint)(iVar56 < auVar51._12_4_);
                      auVar66._4_4_ = iVar117;
                      auVar66._0_4_ = iVar117;
                      auVar66._8_4_ = iVar126;
                      auVar66._12_4_ = iVar126;
                      auVar100._4_4_ = -(uint)(auVar51._4_4_ == iVar39);
                      auVar100._12_4_ = -(uint)(auVar51._12_4_ == iVar56);
                      auVar100._0_4_ = auVar100._4_4_;
                      auVar100._8_4_ = auVar100._12_4_;
                      auVar120._0_4_ = auVar120._4_4_;
                      auVar120._8_4_ = auVar120._12_4_;
                      auVar51 = auVar100 & auVar66 | auVar120;
                      auVar51 = packssdw(auVar51,auVar51);
                      auVar5._8_4_ = 0xffffffff;
                      auVar5._0_8_ = 0xffffffffffffffff;
                      auVar5._12_4_ = 0xffffffff;
                      auVar51 = packssdw(auVar51 ^ auVar5,auVar51 ^ auVar5);
                      auVar51 = packsswb(auVar51,auVar51);
                      if ((auVar51 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        *(char *)(psVar43 + uVar34 * 2 + -0x12) = cVar27;
                      }
                      auVar61 = pshufhw(auVar66,auVar66,0x84);
                      auVar98 = pshufhw(auVar100,auVar100,0x84);
                      auVar62 = pshufhw(auVar61,auVar120,0x84);
                      auVar67._8_4_ = 0xffffffff;
                      auVar67._0_8_ = 0xffffffffffffffff;
                      auVar67._12_4_ = 0xffffffff;
                      auVar67 = (auVar62 | auVar98 & auVar61) ^ auVar67;
                      auVar61 = packssdw(auVar67,auVar67);
                      auVar61 = packsswb(auVar61,auVar61);
                      if ((auVar61._6_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar43 + uVar34 * 2 + -0x10) = cVar27;
                      }
                      auVar61 = (auVar46 | _DAT_00112a80) ^ auVar136;
                      iVar117 = -(uint)(iVar33 < auVar61._0_4_);
                      auVar69._4_4_ = -(uint)(iVar39 < auVar61._4_4_);
                      iVar126 = -(uint)(iVar55 < auVar61._8_4_);
                      auVar69._12_4_ = -(uint)(iVar56 < auVar61._12_4_);
                      auVar101._4_4_ = iVar117;
                      auVar101._0_4_ = iVar117;
                      auVar101._8_4_ = iVar126;
                      auVar101._12_4_ = iVar126;
                      auVar51 = pshuflw(auVar51,auVar101,0xe8);
                      auVar68._4_4_ = -(uint)(auVar61._4_4_ == iVar39);
                      auVar68._12_4_ = -(uint)(auVar61._12_4_ == iVar56);
                      auVar68._0_4_ = auVar68._4_4_;
                      auVar68._8_4_ = auVar68._12_4_;
                      auVar137 = pshuflw(auVar137 & auVar57,auVar68,0xe8);
                      auVar69._0_4_ = auVar69._4_4_;
                      auVar69._8_4_ = auVar69._12_4_;
                      auVar57 = pshuflw(auVar51,auVar69,0xe8);
                      auVar129._8_4_ = 0xffffffff;
                      auVar129._0_8_ = 0xffffffffffffffff;
                      auVar129._12_4_ = 0xffffffff;
                      auVar129 = (auVar57 | auVar137 & auVar51) ^ auVar129;
                      auVar57 = packssdw(auVar129,auVar129);
                      auVar57 = packsswb(auVar57,auVar57);
                      if ((auVar57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(char *)(psVar43 + uVar34 * 2 + -0xe) = cVar27;
                      }
                      auVar69 = auVar68 & auVar101 | auVar69;
                      auVar57 = packssdw(auVar69,auVar69);
                      auVar6._8_4_ = 0xffffffff;
                      auVar6._0_8_ = 0xffffffffffffffff;
                      auVar6._12_4_ = 0xffffffff;
                      auVar57 = packssdw(auVar57 ^ auVar6,auVar57 ^ auVar6);
                      auVar57 = packsswb(auVar57,auVar57);
                      if ((auVar57._8_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar43 + uVar34 * 2 + -0xc) = cVar27;
                      }
                      auVar57 = (auVar46 | _DAT_00112a70) ^ auVar136;
                      iVar117 = -(uint)(iVar33 < auVar57._0_4_);
                      auVar121._4_4_ = -(uint)(iVar39 < auVar57._4_4_);
                      iVar126 = -(uint)(iVar55 < auVar57._8_4_);
                      auVar121._12_4_ = -(uint)(iVar56 < auVar57._12_4_);
                      auVar70._4_4_ = iVar117;
                      auVar70._0_4_ = iVar117;
                      auVar70._8_4_ = iVar126;
                      auVar70._12_4_ = iVar126;
                      auVar102._4_4_ = -(uint)(auVar57._4_4_ == iVar39);
                      auVar102._12_4_ = -(uint)(auVar57._12_4_ == iVar56);
                      auVar102._0_4_ = auVar102._4_4_;
                      auVar102._8_4_ = auVar102._12_4_;
                      auVar121._0_4_ = auVar121._4_4_;
                      auVar121._8_4_ = auVar121._12_4_;
                      auVar57 = auVar102 & auVar70 | auVar121;
                      auVar57 = packssdw(auVar57,auVar57);
                      auVar7._8_4_ = 0xffffffff;
                      auVar7._0_8_ = 0xffffffffffffffff;
                      auVar7._12_4_ = 0xffffffff;
                      auVar57 = packssdw(auVar57 ^ auVar7,auVar57 ^ auVar7);
                      auVar57 = packsswb(auVar57,auVar57);
                      if ((auVar57 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                        *(char *)(psVar43 + uVar34 * 2 + -10) = cVar27;
                      }
                      auVar61 = pshufhw(auVar70,auVar70,0x84);
                      auVar98 = pshufhw(auVar102,auVar102,0x84);
                      auVar62 = pshufhw(auVar61,auVar121,0x84);
                      auVar71._8_4_ = 0xffffffff;
                      auVar71._0_8_ = 0xffffffffffffffff;
                      auVar71._12_4_ = 0xffffffff;
                      auVar71 = (auVar62 | auVar98 & auVar61) ^ auVar71;
                      auVar61 = packssdw(auVar71,auVar71);
                      auVar61 = packsswb(auVar61,auVar61);
                      if ((auVar61._10_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar43 + uVar34 * 2 + -8) = cVar27;
                      }
                      auVar61 = (auVar46 | _DAT_00112a60) ^ auVar136;
                      iVar117 = -(uint)(iVar33 < auVar61._0_4_);
                      auVar73._4_4_ = -(uint)(iVar39 < auVar61._4_4_);
                      iVar126 = -(uint)(iVar55 < auVar61._8_4_);
                      auVar73._12_4_ = -(uint)(iVar56 < auVar61._12_4_);
                      auVar103._4_4_ = iVar117;
                      auVar103._0_4_ = iVar117;
                      auVar103._8_4_ = iVar126;
                      auVar103._12_4_ = iVar126;
                      auVar57 = pshuflw(auVar57,auVar103,0xe8);
                      auVar72._4_4_ = -(uint)(auVar61._4_4_ == iVar39);
                      auVar72._12_4_ = -(uint)(auVar61._12_4_ == iVar56);
                      auVar72._0_4_ = auVar72._4_4_;
                      auVar72._8_4_ = auVar72._12_4_;
                      in_XMM6 = pshuflw(auVar137 & auVar51,auVar72,0xe8);
                      in_XMM6 = in_XMM6 & auVar57;
                      auVar73._0_4_ = auVar73._4_4_;
                      auVar73._8_4_ = auVar73._12_4_;
                      auVar51 = pshuflw(auVar57,auVar73,0xe8);
                      auVar130._8_4_ = 0xffffffff;
                      auVar130._0_8_ = 0xffffffffffffffff;
                      auVar130._12_4_ = 0xffffffff;
                      auVar130 = (auVar51 | in_XMM6) ^ auVar130;
                      auVar51 = packssdw(auVar130,auVar130);
                      in_XMM5 = packsswb(auVar51,auVar51);
                      if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        *(char *)(psVar43 + uVar34 * 2 + -6) = cVar27;
                      }
                      auVar73 = auVar72 & auVar103 | auVar73;
                      auVar51 = packssdw(auVar73,auVar73);
                      auVar8._8_4_ = 0xffffffff;
                      auVar8._0_8_ = 0xffffffffffffffff;
                      auVar8._12_4_ = 0xffffffff;
                      auVar51 = packssdw(auVar51 ^ auVar8,auVar51 ^ auVar8);
                      auVar51 = packsswb(auVar51,auVar51);
                      if ((auVar51._12_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar43 + uVar34 * 2 + -4) = cVar27;
                      }
                      auVar51 = (auVar46 | _DAT_00112a50) ^ auVar136;
                      auVar104._0_4_ = -(uint)(iVar33 < auVar51._0_4_);
                      auVar104._4_4_ = -(uint)(iVar39 < auVar51._4_4_);
                      auVar104._8_4_ = -(uint)(iVar55 < auVar51._8_4_);
                      auVar104._12_4_ = -(uint)(iVar56 < auVar51._12_4_);
                      auVar74._4_4_ = auVar104._0_4_;
                      auVar74._0_4_ = auVar104._0_4_;
                      auVar74._8_4_ = auVar104._8_4_;
                      auVar74._12_4_ = auVar104._8_4_;
                      auVar47._4_4_ = -(uint)(auVar51._4_4_ == iVar39);
                      auVar47._12_4_ = -(uint)(auVar51._12_4_ == iVar56);
                      auVar47._0_4_ = auVar47._4_4_;
                      auVar47._8_4_ = auVar47._12_4_;
                      auVar52._4_4_ = auVar104._4_4_;
                      auVar52._0_4_ = auVar104._4_4_;
                      auVar52._8_4_ = auVar104._12_4_;
                      auVar52._12_4_ = auVar104._12_4_;
                      auVar51 = packssdw(auVar104,auVar47 & auVar74 | auVar52);
                      auVar9._8_4_ = 0xffffffff;
                      auVar9._0_8_ = 0xffffffffffffffff;
                      auVar9._12_4_ = 0xffffffff;
                      auVar51 = packssdw(auVar51 ^ auVar9,auVar51 ^ auVar9);
                      auVar51 = packsswb(auVar51,auVar51);
                      if ((auVar51 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        *(char *)(psVar43 + uVar34 * 2 + -2) = cVar27;
                      }
                      auVar137 = pshufhw(auVar74,auVar74,0x84);
                      auVar51 = pshufhw(auVar47,auVar47,0x84);
                      auVar57 = pshufhw(auVar52,auVar52,0x84);
                      auVar10._8_4_ = 0xffffffff;
                      auVar10._0_8_ = 0xffffffffffffffff;
                      auVar10._12_4_ = 0xffffffff;
                      auVar51 = packssdw(auVar51 & auVar137,(auVar57 | auVar51 & auVar137) ^ auVar10
                                        );
                      auVar51 = packsswb(auVar51,auVar51);
                      if ((auVar51._14_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar43 + uVar34 * 2) = cVar27;
                      }
                      uVar34 = uVar34 + 0x10;
                    } while ((uVar41 + 0xf & 0xfffffff0) != uVar34);
                  }
                  uVar32 = uVar32 + 1;
                  psVar43 = (stbi__uint16 *)((long)psVar43 + 1);
                } while (uVar32 != 4);
              }
              if (3 < uVar35) {
                if (ri->bits_per_channel == 0x10) {
                  if (0 < (int)uVar41) {
                    uVar32 = 0;
                    do {
                      uVar1 = data[uVar32 * 4 + 3];
                      if ((uVar1 != 0) && (uVar1 != 0xffff)) {
                        fVar118 = 1.0 / ((float)uVar1 / 65535.0);
                        fVar95 = (1.0 - fVar118) * 65535.0;
                        auVar136._0_4_ =
                             (int)(fVar95 + fVar118 * (float)(*(uint *)(data + uVar32 * 4) & 0xffff)
                                  );
                        auVar136._4_4_ =
                             (int)(fVar95 + fVar118 * (float)(*(uint *)(data + uVar32 * 4) >> 0x10))
                        ;
                        auVar136._8_4_ = (int)(fVar95 + fVar118 * 0.0);
                        auVar136._12_4_ = (int)(fVar95 + fVar118 * 0.0);
                        auVar136 = pshuflw(auVar136,auVar136,0xe8);
                        *(int *)(data + uVar32 * 4) = auVar136._0_4_;
                        data[uVar32 * 4 + 2] =
                             (stbi__uint16)(int)((float)data[uVar32 * 4 + 2] * fVar118 + fVar95);
                      }
                      uVar32 = uVar32 + 1;
                    } while (uVar42 != uVar32);
                  }
                }
                else if (0 < (int)uVar41) {
                  uVar32 = 0;
                  do {
                    bVar26 = *(byte *)((long)data + uVar32 * 4 + 3);
                    if ((bVar26 != 0) && (bVar26 != 0xff)) {
                      fVar118 = 1.0 / ((float)bVar26 / 255.0);
                      fVar95 = (1.0 - fVar118) * 255.0;
                      *(char *)(data + uVar32 * 2) =
                           (char)(int)((float)(byte)data[uVar32 * 2] * fVar118 + fVar95);
                      *(char *)((long)data + uVar32 * 4 + 1) =
                           (char)(int)((float)*(byte *)((long)data + uVar32 * 4 + 1) * fVar118 +
                                      fVar95);
                      *(char *)(data + uVar32 * 2 + 1) =
                           (char)(int)((float)(byte)data[uVar32 * 2 + 1] * fVar118 + fVar95);
                    }
                    uVar32 = uVar32 + 1;
                  } while (uVar42 != uVar32);
                }
              }
              if ((req_comp & 0xfffffffbU) != 0) {
                if (ri->bits_per_channel == 0x10) {
                  data = stbi__convert_format16(data,4,req_comp,x_00,sVar29);
                }
                else {
                  data = (stbi__uint16 *)stbi__convert_format((uchar *)data,4,req_comp,x_00,sVar29);
                }
                if (data == (stbi__uint16 *)0x0) {
                  return (void *)0x0;
                }
              }
              if (comp != (int *)0x0) {
                *comp = 4;
              }
              *y = sVar29;
              *x = x_00;
              return data;
            }
            stbi__g_failure_reason = "outofmem";
          }
        }
        else {
          stbi__g_failure_reason = "bad compression";
        }
      }
      else {
        stbi__g_failure_reason = "wrong color format";
      }
    }
    else {
      stbi__g_failure_reason = "unsupported bit depth";
    }
  }
  else {
    stbi__g_failure_reason = "wrong channel count";
  }
  return (void *)0x0;
}

Assistant:

static void *stbi__psd_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   int pixelCount;
   int channelCount, compression;
   int channel, i;
   int bitdepth;
   int w,h;
   stbi_uc *out;
   STBI_NOTUSED(ri);

   // Check identifier
   if (stbi__get32be(s) != 0x38425053)   // "8BPS"
      return stbi__errpuc("not PSD", "Corrupt PSD image");

   // Check file type version.
   if (stbi__get16be(s) != 1)
      return stbi__errpuc("wrong version", "Unsupported version of PSD image");

   // Skip 6 reserved bytes.
   stbi__skip(s, 6 );

   // Read the number of channels (R, G, B, A, etc).
   channelCount = stbi__get16be(s);
   if (channelCount < 0 || channelCount > 16)
      return stbi__errpuc("wrong channel count", "Unsupported number of channels in PSD image");

   // Read the rows and columns of the image.
   h = stbi__get32be(s);
   w = stbi__get32be(s);

   // Make sure the depth is 8 bits.
   bitdepth = stbi__get16be(s);
   if (bitdepth != 8 && bitdepth != 16)
      return stbi__errpuc("unsupported bit depth", "PSD bit depth is not 8 or 16 bit");

   // Make sure the color mode is RGB.
   // Valid options are:
   //   0: Bitmap
   //   1: Grayscale
   //   2: Indexed color
   //   3: RGB color
   //   4: CMYK color
   //   7: Multichannel
   //   8: Duotone
   //   9: Lab color
   if (stbi__get16be(s) != 3)
      return stbi__errpuc("wrong color format", "PSD is not in RGB color format");

   // Skip the Mode Data.  (It's the palette for indexed color; other info for other modes.)
   stbi__skip(s,stbi__get32be(s) );

   // Skip the image resources.  (resolution, pen tool paths, etc)
   stbi__skip(s, stbi__get32be(s) );

   // Skip the reserved data.
   stbi__skip(s, stbi__get32be(s) );

   // Find out if the data is compressed.
   // Known values:
   //   0: no compression
   //   1: RLE compressed
   compression = stbi__get16be(s);
   if (compression > 1)
      return stbi__errpuc("bad compression", "PSD has an unknown compression format");

   // Check size
   if (!stbi__mad3sizes_valid(4, w, h, 0))
      return stbi__errpuc("too large", "Corrupt PSD");

   // Create the destination image.

   if (!compression && bitdepth == 16 && bpc == 16) {
      out = (stbi_uc *) stbi__malloc_mad3(8, w, h, 0);
      ri->bits_per_channel = 16;
   } else
      out = (stbi_uc *) stbi__malloc(4 * w*h);

   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   pixelCount = w*h;

   // Initialize the data to zero.
   //memset( out, 0, pixelCount * 4 );

   // Finally, the image data.
   if (compression) {
      // RLE as used by .PSD and .TIFF
      // Loop until you get the number of unpacked bytes you are expecting:
      //     Read the next source byte into n.
      //     If n is between 0 and 127 inclusive, copy the next n+1 bytes literally.
      //     Else if n is between -127 and -1 inclusive, copy the next byte -n+1 times.
      //     Else if n is 128, noop.
      // Endloop

      // The RLE-compressed data is preceeded by a 2-byte data count for each row in the data,
      // which we're going to just skip.
      stbi__skip(s, h * channelCount * 2 );

      // Read the RLE data by channel.
      for (channel = 0; channel < 4; channel++) {
         stbi_uc *p;

         p = out+channel;
         if (channel >= channelCount) {
            // Fill this channel with default data.
            for (i = 0; i < pixelCount; i++, p += 4)
               *p = (channel == 3 ? 255 : 0);
         } else {
            // Read the RLE data.
            if (!stbi__psd_decode_rle(s, p, pixelCount)) {
               STBI_FREE(out);
               return stbi__errpuc("corrupt", "bad RLE data");
            }
         }
      }

   } else {
      // We're at the raw image data.  It's each channel in order (Red, Green, Blue, Alpha, ...)
      // where each channel consists of an 8-bit (or 16-bit) value for each pixel in the image.

      // Read the data by channel.
      for (channel = 0; channel < 4; channel++) {
         if (channel >= channelCount) {
            // Fill this channel with default data.
            if (bitdepth == 16 && bpc == 16) {
               stbi__uint16 *q = ((stbi__uint16 *) out) + channel;
               stbi__uint16 val = channel == 3 ? 65535 : 0;
               for (i = 0; i < pixelCount; i++, q += 4)
                  *q = val;
            } else {
               stbi_uc *p = out+channel;
               stbi_uc val = channel == 3 ? 255 : 0;
               for (i = 0; i < pixelCount; i++, p += 4)
                  *p = val;
            }
         } else {
            if (ri->bits_per_channel == 16) {    // output bpc
               stbi__uint16 *q = ((stbi__uint16 *) out) + channel;
               for (i = 0; i < pixelCount; i++, q += 4)
                  *q = (stbi__uint16) stbi__get16be(s);
            } else {
               stbi_uc *p = out+channel;
               if (bitdepth == 16) {  // input bpc
                  for (i = 0; i < pixelCount; i++, p += 4)
                     *p = (stbi_uc) (stbi__get16be(s) >> 8);
               } else {
                  for (i = 0; i < pixelCount; i++, p += 4)
                     *p = stbi__get8(s);
               }
            }
         }
      }
   }

   // remove weird white matte from PSD
   if (channelCount >= 4) {
      if (ri->bits_per_channel == 16) {
         for (i=0; i < w*h; ++i) {
            stbi__uint16 *pixel = (stbi__uint16 *) out + 4*i;
            if (pixel[3] != 0 && pixel[3] != 65535) {
               float a = pixel[3] / 65535.0f;
               float ra = 1.0f / a;
               float inv_a = 65535.0f * (1 - ra);
               pixel[0] = (stbi__uint16) (pixel[0]*ra + inv_a);
               pixel[1] = (stbi__uint16) (pixel[1]*ra + inv_a);
               pixel[2] = (stbi__uint16) (pixel[2]*ra + inv_a);
            }
         }
      } else {
         for (i=0; i < w*h; ++i) {
            unsigned char *pixel = out + 4*i;
            if (pixel[3] != 0 && pixel[3] != 255) {
               float a = pixel[3] / 255.0f;
               float ra = 1.0f / a;
               float inv_a = 255.0f * (1 - ra);
               pixel[0] = (unsigned char) (pixel[0]*ra + inv_a);
               pixel[1] = (unsigned char) (pixel[1]*ra + inv_a);
               pixel[2] = (unsigned char) (pixel[2]*ra + inv_a);
            }
         }
      }
   }

   // convert to desired output format
   if (req_comp && req_comp != 4) {
      if (ri->bits_per_channel == 16)
         out = (stbi_uc *) stbi__convert_format16((stbi__uint16 *) out, 4, req_comp, w, h);
      else
         out = stbi__convert_format(out, 4, req_comp, w, h);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }

   if (comp) *comp = 4;
   *y = h;
   *x = w;

   return out;
}